

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::dec_writer>
::operator()(padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::dec_writer>
             *this,char **it)

{
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::dec_writer>
  *ppVar1;
  char *__s;
  undefined1 auVar2 [16];
  byte bVar3;
  size_t sVar4;
  long lVar5;
  undefined1 *puVar6;
  ulong uVar7;
  ulong uVar8;
  ptrdiff_t _Num;
  char *pcVar9;
  ptrdiff_t _Num_1;
  undefined1 auVar10 [16];
  char buffer [78];
  char *in_stack_ffffffffffffff68;
  undefined1 local_88 [88];
  
  sVar4 = *(size_t *)(this + 0x10);
  if (sVar4 != 0) {
    pcVar9 = *it;
    memmove(pcVar9,*(void **)(this + 8),sVar4);
    *it = pcVar9 + sVar4;
  }
  __s = *it;
  sVar4 = *(size_t *)(this + 0x20);
  pcVar9 = __s;
  if (sVar4 != 0) {
    pcVar9 = __s + sVar4;
    memset(__s,*(int *)(this + 0x18),sVar4);
  }
  *it = pcVar9;
  sVar4 = (size_t)*(int *)(this + 0x40);
  if ((long)sVar4 < 0) {
    assert_fail((char *)it,0,in_stack_ffffffffffffff68);
  }
  ppVar1 = this + 0x30;
  auVar10 = *(undefined1 (*) [16])ppVar1;
  auVar2 = *(undefined1 (*) [16])ppVar1;
  puVar6 = local_88 + sVar4;
  if ((ulong)(*(ulong *)ppVar1 < 100) <= *(ulong *)(this + 0x38)) {
    do {
      lVar5 = auVar2._8_8_;
      uVar8 = auVar2._0_8_;
      auVar10 = __udivti3(uVar8,lVar5,100,0);
      uVar7 = (ulong)(uint)(auVar2._0_4_ + auVar10._0_4_ * -100);
      puVar6[-1] = basic_data<void>::digits[(uVar7 * 2 & 0xffffffff) + 1];
      puVar6[-2] = basic_data<void>::digits[uVar7 * 2];
      puVar6 = puVar6 + -2;
      auVar2 = auVar10;
    } while (lVar5 != 0 || (ulong)-lVar5 < (ulong)(9999 < uVar8));
  }
  if (auVar10._8_8_ == 0 && (ulong)(9 < auVar10._0_8_) <= (ulong)-auVar10._8_8_) {
    bVar3 = auVar10[0] | 0x30;
    lVar5 = -1;
  }
  else {
    uVar7 = auVar10._0_8_ * 2;
    puVar6[-1] = basic_data<void>::digits[(uVar7 & 0xffffffff) + 1];
    bVar3 = basic_data<void>::digits[uVar7 & 0x1fffffffe];
    lVar5 = -2;
  }
  puVar6[lVar5] = bVar3;
  if ((int)sVar4 != 0) {
    memcpy(pcVar9,local_88,sVar4);
  }
  *it = pcVar9 + sVar4;
  return;
}

Assistant:

void operator()(It&& it) const {
      if (prefix.size() != 0)
        it = copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }